

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

int matchreg(match *res,reg *reg,easm_expr *expr,iasctx *ctx)

{
  sreg *psVar1;
  char *__s;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ull num;
  char *pcVar6;
  char *end;
  byte *local_38;
  
  psVar1 = reg->specials;
  if (psVar1 != (sreg *)0x0) {
    iVar3 = psVar1->num;
    while (iVar3 != -1) {
      if ((psVar1->fmask == 0) || ((psVar1->fmask & ~*ctx->varinfo->fmask) == 0)) {
        switch(psVar1->mode) {
        case SR_NAMED:
          if ((expr->type == EASM_EXPR_REG) && (iVar2 = strcmp(expr->str,psVar1->name), iVar2 == 0))
          {
LAB_0026d1ea:
            iVar3 = setbf(res,reg->bf,(long)iVar3);
            return iVar3;
          }
          break;
        case SR_ZERO:
          if ((expr->type == EASM_EXPR_NUM) && (expr->num == 0)) goto LAB_0026d1ea;
          break;
        case SR_ONE:
          if ((expr->type == EASM_EXPR_NUM) && (expr->num == 1)) goto LAB_0026d1ea;
          break;
        case SR_DISCARD:
          if (expr->type == EASM_EXPR_DISCARD) goto LAB_0026d1ea;
        }
      }
      iVar3 = psVar1[1].num;
      psVar1 = psVar1 + 1;
    }
  }
  uVar4 = 0;
  if (expr->type == EASM_EXPR_REG) {
    pcVar6 = expr->str;
    __s = reg->name;
    sVar5 = strlen(__s);
    iVar3 = strncmp(pcVar6,__s,sVar5);
    if (iVar3 == 0) {
      num = strtoull(pcVar6 + sVar5,(char **)&local_38,10);
      if (reg->hilo == 0) {
        pcVar6 = "";
        if (reg->suffix != (char *)0x0) {
          pcVar6 = reg->suffix;
        }
        iVar3 = strcmp((char *)local_38,pcVar6);
        if (iVar3 != 0) {
          return 0;
        }
      }
      else {
        sVar5 = strlen((char *)local_38);
        if (sVar5 != 1) {
          return 0;
        }
        if ((*local_38 | 4) != 0x6c) {
          return 0;
        }
        num = (ulong)(*local_38 == 0x68) + num * 2;
      }
      if (reg->bf == (bitfield *)0x0) {
        uVar4 = (uint)(num == 0);
      }
      else {
        uVar4 = setbf(res,reg->bf,num);
      }
    }
  }
  return uVar4;
}

Assistant:

int matchreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, struct iasctx *ctx) {
	if (reg->specials) {
		int i = 0;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (!var_ok(reg->specials[i].fmask, 0, ctx->varinfo))
				continue;
			switch (reg->specials[i].mode) {
				case SR_NAMED:
					if (expr->type == EASM_EXPR_REG && !strcmp(expr->str, reg->specials[i].name))
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ZERO:
					if (expr->type == EASM_EXPR_NUM && expr->num == 0)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ONE:
					if (expr->type == EASM_EXPR_NUM && expr->num == 1)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_DISCARD:
					if (expr->type == EASM_EXPR_DISCARD)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
			}
		}
	}
	if (expr->type != EASM_EXPR_REG)
		return 0;
	if (strncmp(expr->str, reg->name, strlen(reg->name)))
		return 0;
	const char *str = expr->str + strlen(reg->name);
	char *end;
	ull num = strtoull(str, &end, 10);
	if (!reg->hilo) {
		if (strcmp(end, (reg->suffix?reg->suffix:"")))
			return 0;
	} else {
		if (strlen(end) != 1)
			return 0;
		if (*end != 'h' && *end != 'l')
			return 0;
		num <<= 1;
		if (*end == 'h')
			num |= 1;
	}
	if (reg->bf)
		return setbf(res, reg->bf, num);
	else
		return !num;
}